

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeGlobalGet(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name global)

{
  Name name;
  Global *pGVar1;
  GlobalGet *expr;
  Ok local_51;
  IRBuilder *local_50;
  char *local_48;
  uintptr_t local_40;
  IRBuilder *local_38;
  char *local_30;
  IRBuilder *local_28;
  IRBuilder *this_local;
  Name global_local;
  
  local_48 = global.super_IString.str._M_str;
  local_50 = global.super_IString.str._M_len;
  local_38 = local_50;
  local_30 = local_48;
  local_28 = this;
  this_local = local_50;
  global_local.super_IString.str._M_len = (size_t)local_48;
  global_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  pGVar1 = Module::getGlobal(this->wasm,global);
  local_40 = (pGVar1->type).id;
  name.super_IString.str._M_str = local_30;
  name.super_IString.str._M_len = (size_t)local_38;
  expr = Builder::makeGlobalGet(&this->builder,name,(Type)local_40);
  push(this,(Expression *)expr);
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_51);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeGlobalGet(Name global) {
  push(builder.makeGlobalGet(global, wasm.getGlobal(global)->type));
  return Ok{};
}